

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O2

bool __thiscall
ASecActHitFakeFloor::DoTriggerAction(ASecActHitFakeFloor *this,AActor *triggerer,int activationType)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  if (((uint)activationType >> 10 & 1) != 0) {
    bVar1 = ASectorAction::CheckTrigger(&this->super_ASectorAction,triggerer);
  }
  bVar2 = ASectorAction::DoTriggerAction(&this->super_ASectorAction,triggerer,activationType);
  return (bool)(bVar2 | bVar1);
}

Assistant:

bool ASecActHitFakeFloor::DoTriggerAction (AActor *triggerer, int activationType)
{
	bool didit = (activationType & SECSPAC_HitFakeFloor) ? CheckTrigger (triggerer) : false;
	return didit | Super::DoTriggerAction (triggerer, activationType);
}